

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

int Sfm_LibFindDelayMatches
              (Sfm_Lib_t *p,word *pTruth,int *pFanins,int nFanins,Vec_Ptr_t *vGates,Vec_Ptr_t *vFans
              )

{
  int *piVar1;
  size_t sVar2;
  char cVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  void **ppvVar7;
  long lVar8;
  void *pvVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  Sfm_Fun_t *pSVar13;
  Mio_Cell2_t *pMVar14;
  int iVar15;
  word pCopy [4];
  word local_58;
  word wStack_50;
  word local_48;
  word wStack_40;
  
  if (6 < nFanins) {
    local_58 = *pTruth;
    wStack_50 = pTruth[1];
    local_48 = pTruth[2];
    wStack_40 = pTruth[3];
    Dau_DsdPrintFromTruth(&local_58,p->nVars);
  }
  vGates->nSize = 0;
  vFans->nSize = 0;
  lVar4 = (long)p->nWords;
  if (0 < lVar4) {
    lVar8 = 0;
    do {
      if (pTruth[lVar8] != 0) {
        lVar8 = 0;
        goto LAB_00531f49;
      }
      lVar8 = lVar8 + 1;
    } while (lVar4 != lVar8);
  }
  goto LAB_00531f95;
  while (lVar8 = lVar8 + 1, lVar4 != lVar8) {
LAB_00531f49:
    if (pTruth[lVar8] != 0xffffffffffffffff) {
      lVar8 = 0;
      goto LAB_00531f67;
    }
  }
  goto LAB_00531f95;
  while (lVar8 = lVar8 + 8, lVar4 * 8 != lVar8) {
LAB_00531f67:
    if (*(long *)((long)pTruth + lVar8) != *(long *)((long)s_Truth8[0] + lVar8)) {
      lVar8 = 0;
      do {
        if ((*(ulong *)((long)s_Truth8[0] + lVar8) ^ *(ulong *)((long)pTruth + lVar8)) !=
            0xffffffffffffffff) {
          puVar5 = (uint *)Vec_MemHashLookup(p->vTtMem,pTruth);
          uVar11 = *puVar5;
          uVar6 = (ulong)uVar11;
          if (uVar6 == 0xffffffff) {
            if ((6 < nFanins) || (iVar15 = 0, p->fVerbose != 0)) {
              iVar15 = 0;
              printf("Not found in the precomputed library: ");
              Dau_DsdPrintFromTruth(pTruth,nFanins);
            }
          }
          else {
            if (((int)uVar11 < 0) || ((p->vHits).nSize <= (int)uVar11)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar1 = (p->vHits).pArray + uVar6;
            *piVar1 = *piVar1 + 1;
            if ((p->vLists).nSize <= (int)uVar11) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar4 = (long)(p->vLists).pArray[uVar6];
            if ((lVar4 != -1) && (p->pObjs != (Sfm_Fun_t *)0x0)) {
              pSVar13 = p->pObjs + lVar4;
              do {
                pMVar14 = p->pCells;
                cVar3 = pSVar13->pFansT[0];
                pvVar9 = pMVar14[pSVar13->pFansB[0]].pMioGate;
                uVar11 = vGates->nCap;
                uVar12 = vGates->nSize;
                if (uVar12 == uVar11) {
                  if ((int)uVar12 < 0x10) {
                    if (vGates->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar7 = (void **)realloc(vGates->pArray,0x80);
                    }
                    uVar11 = 0x10;
                  }
                  else {
                    uVar11 = uVar12 * 2;
                    if (vGates->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc((ulong)uVar12 << 4);
                    }
                    else {
                      ppvVar7 = (void **)realloc(vGates->pArray,(ulong)uVar12 << 4);
                    }
                  }
                  vGates->pArray = ppvVar7;
                  vGates->nCap = uVar11;
                  uVar12 = vGates->nSize;
                }
                else {
                  ppvVar7 = vGates->pArray;
                }
                pMVar14 = pMVar14 + cVar3;
                vGates->nSize = uVar12 + 1;
                ppvVar7[(int)uVar12] = pvVar9;
                if (pMVar14 == p->pCells) {
                  pvVar9 = (void *)0x0;
                }
                else {
                  pvVar9 = pMVar14->pMioGate;
                }
                if (uVar12 + 1 == uVar11) {
                  if ((int)uVar12 < 0xf) {
                    if (vGates->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar7 = (void **)realloc(vGates->pArray,0x80);
                    }
                    vGates->pArray = ppvVar7;
                    vGates->nCap = 0x10;
                  }
                  else {
                    sVar2 = (ulong)(uVar11 * 2) * 8;
                    if (vGates->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc(sVar2);
                    }
                    else {
                      ppvVar7 = (void **)realloc(vGates->pArray,sVar2);
                    }
                    vGates->pArray = ppvVar7;
                    vGates->nCap = uVar11 * 2;
                  }
                }
                else {
                  ppvVar7 = vGates->pArray;
                }
                iVar15 = vGates->nSize;
                vGates->nSize = iVar15 + 1;
                ppvVar7[iVar15] = pvVar9;
                uVar11 = vFans->nCap;
                uVar12 = vFans->nSize;
                if (uVar12 == uVar11) {
                  if ((int)uVar12 < 0x10) {
                    if (vFans->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar7 = (void **)realloc(vFans->pArray,0x80);
                    }
                    uVar11 = 0x10;
                  }
                  else {
                    uVar11 = uVar12 * 2;
                    if (vFans->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc((ulong)uVar12 << 4);
                    }
                    else {
                      ppvVar7 = (void **)realloc(vFans->pArray,(ulong)uVar12 << 4);
                    }
                  }
                  vFans->pArray = ppvVar7;
                  vFans->nCap = uVar11;
                  uVar12 = vFans->nSize;
                }
                else {
                  ppvVar7 = vFans->pArray;
                }
                vFans->nSize = uVar12 + 1;
                ppvVar7[(int)uVar12] = pSVar13->pFansB + 1;
                pcVar10 = (char *)0x0;
                if (pMVar14 != p->pCells) {
                  pcVar10 = pSVar13->pFansT + 1;
                }
                if (uVar12 + 1 == uVar11) {
                  if ((int)uVar12 < 0xf) {
                    if (vFans->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar7 = (void **)realloc(vFans->pArray,0x80);
                    }
                    vFans->pArray = ppvVar7;
                    vFans->nCap = 0x10;
                  }
                  else {
                    sVar2 = (ulong)(uVar11 * 2) * 8;
                    if (vFans->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc(sVar2);
                    }
                    else {
                      ppvVar7 = (void **)realloc(vFans->pArray,sVar2);
                    }
                    vFans->pArray = ppvVar7;
                    vFans->nCap = uVar11 * 2;
                  }
                }
                else {
                  ppvVar7 = vFans->pArray;
                }
                iVar15 = vFans->nSize;
                vFans->nSize = iVar15 + 1;
                ppvVar7[iVar15] = pcVar10;
              } while (((long)pSVar13->Next != -1) &&
                      (pSVar13 = p->pObjs + pSVar13->Next, p->pObjs != (Sfm_Fun_t *)0x0));
            }
            iVar15 = vGates->nSize / 2;
          }
          return iVar15;
        }
        lVar8 = lVar8 + 8;
      } while (lVar4 * 8 != lVar8);
      break;
    }
  }
LAB_00531f95:
  __assert_fail("!Abc_TtIsConst0(pTruth, p->nWords) && !Abc_TtIsConst1(pTruth, p->nWords) && !Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) && !Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                ,0x282,
                "int Sfm_LibFindDelayMatches(Sfm_Lib_t *, word *, int *, int, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

int Sfm_LibFindDelayMatches( Sfm_Lib_t * p, word * pTruth, int * pFanins, int nFanins, Vec_Ptr_t * vGates, Vec_Ptr_t * vFans )
{
    Sfm_Fun_t * pObj;
    Mio_Cell2_t * pCellB, * pCellT;
    int iFunc;
    if ( nFanins > 6 )
    {
        word pCopy[4];
        Abc_TtCopy( pCopy, pTruth, 4, 0 );
        Dau_DsdPrintFromTruth( pCopy, p->nVars );
    }
    Vec_PtrClear( vGates );
    Vec_PtrClear( vFans );
    // look for gate
    assert( !Abc_TtIsConst0(pTruth, p->nWords) && 
            !Abc_TtIsConst1(pTruth, p->nWords) && 
            !Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) && 
            !Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords) );
    iFunc = *Vec_MemHashLookup( p->vTtMem,  pTruth );
    if ( iFunc == -1 )
    {
        // print functions not found in the library
        if ( p->fVerbose || nFanins > 6 )
        {
            printf( "Not found in the precomputed library: " );
            Dau_DsdPrintFromTruth( pTruth, nFanins );
        }
        return 0;
    }
    Vec_IntAddToEntry( &p->vHits, iFunc, 1 );
    // collect matches
    Sfm_LibForEachSuper( p, pObj, iFunc )
    {
        pCellB = p->pCells + (int)pObj->pFansB[0];
        pCellT = p->pCells + (int)pObj->pFansT[0];
        Vec_PtrPush( vGates, pCellB->pMioGate );
        Vec_PtrPush( vGates, pCellT == p->pCells ? NULL : pCellT->pMioGate );
        Vec_PtrPush( vFans, pObj->pFansB + 1 );
        Vec_PtrPush( vFans, pCellT == p->pCells ? NULL : pObj->pFansT + 1 );
    }
    return Vec_PtrSize(vGates) / 2;
}